

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  undefined4 uVar1;
  size_t sVar2;
  uchar **ppuVar3;
  char *pcVar4;
  bool bVar5;
  int i;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int iVar16;
  int iVar17;
  char *pcVar18;
  int i_3;
  int iVar19;
  int iVar20;
  pointer pcVar21;
  float fVar22;
  allocator local_449;
  char *local_448;
  int local_440;
  int local_43c;
  EXRImage exr_image;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  string ch_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  EXRVersion exr_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  string local_360 [32];
  EXRHeader exr_header;
  stringstream ss;
  string local_1b0 [8];
  ostream local_1a8 [376];
  
  if (out_rgba == (float **)0x0) {
    std::__cxx11::string::string
              ((string *)&exr_header,"Invalid argument for LoadEXR()",(allocator *)&ss);
    tinyexr::SetErrorMessage((string *)&exr_header,err);
    std::__cxx11::string::~string((string *)&exr_header);
    return -3;
  }
  memset(&exr_header,0,0x188);
  exr_image.tiles = (EXRTile *)0x0;
  exr_image.next_level = (TEXRImage *)0x0;
  exr_image.level_x = 0;
  exr_image.level_y = 0;
  exr_image.images = (uchar **)0x0;
  exr_image.width = 0;
  exr_image.height = 0;
  exr_image.num_channels = 0;
  exr_image.num_tiles = 0;
  iVar6 = ParseEXRVersionFromFile(&exr_version,filename);
  if (iVar6 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_1a8,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    std::operator<<(poVar7,")");
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage(&ch_name,err);
    std::__cxx11::string::~string((string *)&ch_name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return iVar6;
  }
  if (exr_version.non_image != 0 || exr_version.multipart != 0) {
    std::__cxx11::string::string
              ((string *)&ss,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               (allocator *)&ch_name);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    return -4;
  }
  iVar6 = ParseEXRHeaderFromFile(&exr_header,&exr_version,filename,err);
  if (iVar6 != 0) {
LAB_001af21d:
    FreeEXRHeader(&exr_header);
    return iVar6;
  }
  for (lVar8 = 0; lVar8 < exr_header.num_channels; lVar8 = lVar8 + 1) {
    if (exr_header.pixel_types[lVar8] == 1) {
      exr_header.requested_pixel_types[lVar8] = 2;
    }
  }
  iVar6 = LoadEXRImageFromFile(&exr_image,&exr_header,filename,err);
  if (iVar6 != 0) goto LAB_001af21d;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers(&exr_header,&layer_names);
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448 = layername;
  if (layername == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_3b0,"",&local_449);
  }
  else {
    std::__cxx11::string::string((string *)&local_3b0,layername,&local_449);
  }
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::clear(&channels);
  lVar8 = 0;
  for (pcVar21 = (pointer)0x0; (long)pcVar21 < (long)exr_header.num_channels; pcVar21 = pcVar21 + 1)
  {
    std::__cxx11::string::string
              ((string *)&ch_name,(exr_header.channels)->name + lVar8,(allocator *)&ss);
    if (local_3b0._M_string_length == 0) {
      uVar10 = std::__cxx11::string::rfind((char)&ch_name,0x2e);
      if ((uVar10 != 0xffffffffffffffff) && (uVar10 < ch_name._M_string_length)) {
        std::__cxx11::string::substr((ulong)&ss,(ulong)&ch_name);
LAB_001af383:
        std::__cxx11::string::operator=((string *)&ch_name,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
LAB_001af396:
      std::__cxx11::string::string(local_360,(string *)&ch_name);
      _ss = pcVar21;
      std::__cxx11::string::string(local_1b0,local_360);
      std::__cxx11::string::~string(local_360);
      std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                (&channels,(value_type *)&ss);
      std::__cxx11::string::~string(local_1b0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_3b0,'.');
      lVar9 = std::__cxx11::string::find((string *)&ch_name,(ulong)&ss);
      std::__cxx11::string::~string((string *)&ss);
      if (lVar9 != -1) {
        if (lVar9 == 0) {
          std::__cxx11::string::substr((ulong)&ss,(ulong)&ch_name);
          goto LAB_001af383;
        }
        goto LAB_001af396;
      }
    }
    std::__cxx11::string::~string((string *)&ch_name);
    lVar8 = lVar8 + 0x110;
  }
  std::__cxx11::string::~string((string *)&local_3b0);
  if ((long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    std::__cxx11::string::string((string *)&ss,"Layer Not Found",(allocator *)&ch_name);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    iVar6 = -0xd;
    goto LAB_001af9ae;
  }
  uVar11 = ((long)channels.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)channels.
                 super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x28;
  uVar10 = 4;
  if (uVar11 < 4) {
    uVar10 = uVar11;
  }
  iVar6 = -1;
  local_440 = -1;
  local_448 = (char *)CONCAT44(local_448._4_4_,0xffffffff);
  local_43c = local_440;
  for (lVar8 = 0; iVar16 = local_43c, iVar13 = local_440, uVar10 * 0x28 - lVar8 != 0;
      lVar8 = lVar8 + 0x28) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&((channels.
                      super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar8);
    piVar15 = (int *)((long)&(channels.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar8);
    bVar5 = std::operator==(__lhs,"R");
    if (bVar5) {
      local_448 = (char *)CONCAT44(local_448._4_4_,*piVar15);
    }
    else {
      bVar5 = std::operator==(__lhs,"G");
      if (bVar5) {
        local_43c = *piVar15;
      }
      else {
        bVar5 = std::operator==(__lhs,"B");
        if (bVar5) {
          local_440 = *piVar15;
        }
        else {
          bVar5 = std::operator==(__lhs,"A");
          if (bVar5) {
            iVar6 = *piVar15;
          }
        }
      }
    }
  }
  if ((long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar2 = (channels.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    uVar10 = (ulong)exr_image.width;
    uVar11 = (ulong)exr_image.height;
    pfVar12 = (float *)malloc(uVar10 * uVar11 * 0x10);
    *out_rgba = pfVar12;
    iVar6 = (int)sVar2;
    if (exr_header.tiled == 0) {
      lVar8 = 0;
      for (lVar9 = 0; lVar9 < (int)uVar11 * (int)uVar10; lVar9 = lVar9 + 1) {
        uVar1 = *(undefined4 *)(exr_image.images[iVar6] + lVar9 * 4);
        *(undefined4 *)((long)*out_rgba + lVar8) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar8 + 4) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar8 + 8) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar8 + 0xc) = uVar1;
        uVar10 = exr_image._32_8_ & 0xffffffff;
        uVar11 = (ulong)(uint)exr_image.height;
        lVar8 = lVar8 + 0x10;
      }
    }
    else {
      for (lVar8 = 0; lVar8 < exr_image.num_tiles; lVar8 = lVar8 + 1) {
        for (iVar13 = 0; iVar13 < exr_header.tile_size_y; iVar13 = iVar13 + 1) {
          for (iVar16 = 0; iVar16 < exr_header.tile_size_x; iVar16 = iVar16 + 1) {
            iVar17 = exr_image.tiles[lVar8].offset_x * exr_header.tile_size_x + iVar16;
            if ((iVar17 < exr_image.width) &&
               (iVar14 = exr_header.tile_size_y * exr_image.tiles[lVar8].offset_y + iVar13,
               iVar14 < exr_image.height)) {
              iVar17 = iVar17 + exr_image.width * iVar14;
              ppuVar3 = exr_image.tiles[lVar8].images;
              lVar9 = (long)(exr_header.tile_size_x * iVar13 + iVar16);
              (*out_rgba)[iVar17 * 4] = *(float *)(ppuVar3[iVar6] + lVar9 * 4);
              (*out_rgba)[iVar17 * 4 + 1] = *(float *)(ppuVar3[iVar6] + lVar9 * 4);
              (*out_rgba)[iVar17 * 4 + 2] = *(float *)(ppuVar3[iVar6] + lVar9 * 4);
              (*out_rgba)[iVar17 * 4 + 3] = *(float *)(ppuVar3[iVar6] + lVar9 * 4);
            }
          }
        }
      }
    }
LAB_001af990:
    *width = exr_image.width;
    *height = exr_image.height;
    iVar6 = 0;
  }
  else {
    if ((int)local_448 == -1) {
      std::__cxx11::string::string((string *)&ss,"R channel not found",(allocator *)&ch_name);
    }
    else if (local_43c == -1) {
      std::__cxx11::string::string((string *)&ss,"G channel not found",(allocator *)&ch_name);
    }
    else {
      if (local_440 != -1) {
        uVar10 = (ulong)exr_image.width;
        uVar11 = (ulong)exr_image.height;
        pfVar12 = (float *)malloc(uVar10 * uVar11 * 0x10);
        *out_rgba = pfVar12;
        if (exr_header.tiled == 0) {
          lVar8 = 0;
          for (lVar9 = 0; lVar9 < (int)uVar11 * (int)uVar10; lVar9 = lVar9 + 1) {
            (*out_rgba)[lVar8] = *(float *)(exr_image.images[(int)local_448] + lVar8);
            (*out_rgba)[lVar8 + 1] = *(float *)(exr_image.images[iVar16] + lVar8);
            (*out_rgba)[lVar8 + 2] = *(float *)(exr_image.images[iVar13] + lVar8);
            fVar22 = 1.0;
            if (iVar6 != -1) {
              fVar22 = *(float *)(exr_image.images[iVar6] + lVar8);
            }
            (*out_rgba)[lVar8 + 3] = fVar22;
            uVar10 = exr_image._32_8_ & 0xffffffff;
            uVar11 = (ulong)(uint)exr_image.height;
            lVar8 = lVar8 + 4;
          }
        }
        else {
          lVar8 = (long)(int)local_448;
          pcVar4 = (char *)0x0;
          while (pcVar18 = pcVar4, (long)pcVar18 < (long)exr_image.num_tiles) {
            for (iVar17 = 0; iVar17 < exr_header.tile_size_y; iVar17 = iVar17 + 1) {
              for (iVar14 = 0; iVar14 < exr_header.tile_size_x; iVar14 = iVar14 + 1) {
                iVar19 = exr_image.tiles[(long)pcVar18].offset_x * exr_header.tile_size_x + iVar14;
                if ((iVar19 < exr_image.width) &&
                   (iVar20 = exr_header.tile_size_y * exr_image.tiles[(long)pcVar18].offset_y +
                             iVar17, iVar20 < exr_image.height)) {
                  iVar19 = iVar19 + exr_image.width * iVar20;
                  ppuVar3 = exr_image.tiles[(long)pcVar18].images;
                  lVar9 = (long)(exr_header.tile_size_x * iVar17 + iVar14);
                  (*out_rgba)[iVar19 * 4] = *(float *)(ppuVar3[lVar8] + lVar9 * 4);
                  (*out_rgba)[iVar19 * 4 + 1] = *(float *)(ppuVar3[iVar16] + lVar9 * 4);
                  (*out_rgba)[iVar19 * 4 + 2] = *(float *)(ppuVar3[iVar13] + lVar9 * 4);
                  fVar22 = 1.0;
                  if (iVar6 != -1) {
                    fVar22 = *(float *)(ppuVar3[iVar6] + lVar9 * 4);
                  }
                  (*out_rgba)[(int)(iVar19 * 4 | 3)] = fVar22;
                }
              }
            }
            local_448 = pcVar18;
            pcVar4 = pcVar18 + 1;
          }
        }
        goto LAB_001af990;
      }
      std::__cxx11::string::string((string *)&ss,"B channel not found",(allocator *)&ch_name);
    }
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    iVar6 = -4;
  }
LAB_001af9ae:
  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&channels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&layer_names);
  return iVar6;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}